

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3879a::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::
TestBody(BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test *this)

{
  raw_ostream *prVar1;
  error_code *EC;
  size_type sVar2;
  char *message;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef mainFilename;
  StringRef name;
  BuildSystem system;
  thread cancelThread;
  AssertHelper local_3f0;
  AssertHelper local_3e8;
  AssertionResult gtest_ar;
  __uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  local_3d0;
  AssertionResult gtest_ar_;
  uint local_3ac;
  BuildKey keyToBuild;
  string outputFile;
  MockBuildSystemDelegate delegate;
  Optional<llbuild::buildsystem::BuildValue> result;
  string local_270 [32];
  SmallString<256U> manifest;
  TmpDir tempDir;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&tempDir,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&manifest,&tempDir);
  std::operator+(&outputFile,(string *)&manifest,"/output.txt");
  std::__cxx11::string::_M_dispose();
  for (sVar2 = 0; outputFile._M_string_length != sVar2; sVar2 = sVar2 + 1) {
    if (outputFile._M_dataplus._M_p[sVar2] == '\\') {
      outputFile._M_dataplus._M_p[sVar2] = '/';
    }
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&delegate,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&manifest.super_SmallVector<char,_256U>,
             (char *)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate,
             delegate.super_BuildSystemDelegate.name._M_dataplus._M_p +
             (long)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate);
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&delegate,"manifest.llbuild");
  message = "";
  llvm::Twine::Twine((Twine *)&result,"");
  llvm::Twine::Twine((Twine *)&keyToBuild,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::sys::path::append
            (&manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&delegate,
             (Twine *)&result,(Twine *)&keyToBuild,(Twine *)&gtest_ar_);
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ =
       (ulong)(uint)result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._4_4_ << 0x20;
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._8_8_ =
       std::_V2::system_category();
  EC = (error_code *)&result;
  Filename.Length._4_4_ = 0;
  Filename._0_12_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&delegate,Filename,EC,F_Text);
  if (result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_4_ == 0) {
    llvm::raw_ostream::operator<<
              ((raw_ostream *)&delegate,
               "client:\n  name: mock\n\ncommands:\n  WAIT:\n    tool: shell\n    deps: \"/tmp/deps.info\"\n    deps-style: dependency-info\n    inputs: [\"<cleanup>\"]\n"
              );
    prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)&delegate,"    outputs: [\"");
    prVar1 = llvm::raw_ostream::operator<<(prVar1,&outputFile);
    llvm::raw_ostream::operator<<(prVar1,"\"]\n");
    llvm::raw_ostream::operator<<((raw_ostream *)&delegate,"    description: \"WAIT\"\n    args:\n")
    ;
    prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)&delegate,"      touch ");
    prVar1 = llvm::raw_ostream::operator<<(prVar1,&outputFile);
    llvm::raw_ostream::operator<<(prVar1,"\n");
    llvm::raw_ostream::operator<<((raw_ostream *)&delegate,"      sleep 9999\n");
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&delegate);
    name.Length = (size_t)EC;
    name.Data = (char *)0x4;
    llbuild::buildsystem::BuildKey::makeCommand(&keyToBuild,(BuildKey *)"WAIT",name);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate(&delegate,false);
    llbuild::basic::createLocalFileSystem();
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&system,&delegate.super_BuildSystemDelegate,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_3d0);
    if ((_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
         )local_3d0._M_t.
          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
        (FileSystem *)0x0) {
      (*(*(_func_int ***)
          local_3d0._M_t.
          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)[1])();
    }
    local_3d0._M_t.
    super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
    .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl =
         (tuple<llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>)
         (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          )0x0;
    mainFilename.Length._4_4_ = 0;
    mainFilename._0_12_ =
         manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase._0_12_;
    gtest_ar_.success_ = llbuild::buildsystem::BuildSystem::loadDescription(&system,mainFilename);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      llbuild::basic::createLocalFileSystem();
      cancelThread._M_id._M_thread = (id)0;
      result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ = operator_new(0x20);
      *(undefined ***)result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ =
           &PTR___State_0023b298;
      *(AssertHelper **)(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ + 8)
           = &local_3f0;
      *(string **)(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ + 0x10) =
           &outputFile;
      *(BuildSystem **)
       (result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ + 0x18) = &system;
      std::thread::_M_start_thread(&cancelThread,&result,0);
      if (result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_ != 0) {
        (**(code **)(*(long *)result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_8_
                    + 8))();
      }
      std::__cxx11::string::string(local_270,(string *)&keyToBuild);
      llbuild::buildsystem::BuildSystem::build(&result,&system,(BuildKey *)local_270);
      std::__cxx11::string::_M_dispose();
      std::thread::join();
      llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gtest_ar_,&delegate);
      local_3e8.data_ =
           (AssertHelperData *)
           ((long)gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl - CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) >> 5);
      local_3ac = 0;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&gtest_ar,"delegate.getMessages().size()","0U",
                 (unsigned_long *)&local_3e8,&local_3ac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x1c6,message);
        testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
                (&result.Storage);
      std::thread::~thread(&cancelThread);
      if (local_3f0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_3f0.data_ + 8))();
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result,(internal *)&gtest_ar_,(AssertionResult *)"loadingResult","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x1b0,(char *)result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer.
                                _0_8_);
      testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_3f0);
      std::__cxx11::string::_M_dispose();
      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    llbuild::buildsystem::BuildSystem::~BuildSystem(&system);
    llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
    std::__cxx11::string::_M_dispose();
    llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&manifest);
    std::__cxx11::string::_M_dispose();
    llbuild::TmpDir::~TmpDir(&tempDir);
    return;
  }
  __assert_fail("!ec",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                ,0x198,
                "virtual void (anonymous namespace)::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::TestBody()"
               );
}

Assistant:

TEST(BuildSystemTaskTests, doesNotProcessDependenciesAfterCancellation) {
  TmpDir tempDir(__func__);

  std::string outputFile = tempDir.str() + "/output.txt";
  for (auto& c : outputFile) {
    if (c == '\\')
      c = '/';
  }

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << "client:\n"
"  name: mock\n"
"\n"
"commands:\n"
"  WAIT:\n"
"    tool: shell\n"
"    deps: \"/tmp/deps.info\"\n"
"    deps-style: dependency-info\n"
"    inputs: [\"<cleanup>\"]\n";

    os << "    outputs: [\"" << outputFile << "\"]\n";
    os << "    description: \"WAIT\"\n"
"    args:\n";

    os << "      touch " << outputFile << "\n";
    os << "      sleep 9999\n";
  }

  auto keyToBuild = BuildKey::makeCommand("WAIT");
  MockBuildSystemDelegate delegate;
  BuildSystem system(delegate, basic::createLocalFileSystem());
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);

  std::unique_ptr<llbuild::basic::FileSystem> fs = llbuild::basic::createLocalFileSystem();
  std::thread cancelThread([&] {
    // Busy wait until `outputFile` appears which indicates that `yes` is
    // running.
    time_t start = ::time(NULL);
    while (fs->getFileInfo(outputFile).isMissing()) {
      if (::time(NULL) > start + 5) {
        // We can't fail gracefully because the `LaneBasedExecutionQueue` will
        // always wait for spawned processes to exit
        abort();
      }
    }

    system.cancel();
  });

  auto result = system.build(keyToBuild);

  cancelThread.join();
  // This is what we are testing for, if dependencies were processed, an error would occur during the build
  ASSERT_EQ(delegate.getMessages().size(), 0U);
}